

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

bool __thiscall
wallet::anon_unknown_5::WalletImpl::tryGetTxStatus
          (WalletImpl *this,uint256 *txid,WalletTxStatus *tx_status,int *num_blocks,
          int64_t *block_time)

{
  element_type *peVar1;
  int iVar2;
  iterator iVar3;
  long in_FS_OFFSET;
  bool bVar4;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> locked_wallet;
  bool local_b9;
  undefined1 local_b8 [24];
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  unique_lock<std::recursive_mutex> local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_68._M_owns = false;
  std::unique_lock<std::recursive_mutex>::try_lock(&local_68);
  if (local_68._M_owns == true) {
    iVar3 = std::
            _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(((this->m_wallet).
                      super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                    mapWallet)._M_h,txid);
    bVar4 = iVar3.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
            _M_cur != (__node_type *)0x0;
    if (bVar4) {
      peVar1 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if (peVar1->m_last_block_processed_height < 0) {
        __assert_fail("m_last_block_processed_height >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x3d1,"int wallet::CWallet::GetLastBlockHeight() const");
      }
      *num_blocks = peVar1->m_last_block_processed_height;
      *block_time = -1;
      if (peVar1->m_chain == (Chain *)0x0) {
        __assert_fail("m_chain",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x1f5,"interfaces::Chain &wallet::CWallet::chain() const");
      }
      if (peVar1->m_last_block_processed_height < 0) {
        __assert_fail("m_last_block_processed_height >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.h"
                      ,0x3d7,"uint256 wallet::CWallet::GetLastBlockHash() const");
      }
      local_58 = *(undefined8 *)
                  (peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems;
      uStack_50 = *(undefined8 *)
                   ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 8);
      local_48 = *(undefined4 *)
                  ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x10);
      uStack_44 = *(undefined4 *)
                   ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x14);
      uStack_40 = *(undefined4 *)
                   ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x18);
      uStack_3c = *(undefined4 *)
                   ((peVar1->m_last_block_processed).super_base_blob<256U>.m_data._M_elems + 0x1c);
      uStack_a0 = 0;
      local_78 = 0;
      uStack_70 = 0;
      local_88 = 0;
      uStack_80 = 0;
      local_98 = 0;
      uStack_90 = 0;
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      local_b8._8_4_ = 0;
      local_b8._12_4_ = 0;
      local_b8._16_8_ = block_time;
      iVar2 = (*peVar1->m_chain->_vptr_Chain[10])();
      local_b9 = SUB41(iVar2,0);
      inline_check_non_fatal<bool>
                (&local_b9,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/interfaces.cpp"
                 ,0x175,"tryGetTxStatus",
                 "m_wallet->chain().findBlock(m_wallet->GetLastBlockHash(), FoundBlock().time(block_time))"
                );
      MakeWalletTxStatus((WalletTxStatus *)local_b8,
                         (this->m_wallet).
                         super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (CWalletTx *)
                         ((long)iVar3.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
      tx_status->lock_time = local_b8._16_4_;
      tx_status->is_trusted = (bool)local_b8[0x14];
      tx_status->is_abandoned = (bool)local_b8[0x15];
      tx_status->is_coinbase = (bool)local_b8[0x16];
      tx_status->is_in_main_chain = (bool)local_b8[0x17];
      tx_status->block_height = local_b8._0_4_;
      tx_status->blocks_to_maturity = local_b8._4_4_;
      tx_status->depth_in_main_chain = local_b8._8_4_;
      tx_status->time_received = local_b8._12_4_;
    }
  }
  else {
    bVar4 = false;
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool tryGetTxStatus(const uint256& txid,
        interfaces::WalletTxStatus& tx_status,
        int& num_blocks,
        int64_t& block_time) override
    {
        TRY_LOCK(m_wallet->cs_wallet, locked_wallet);
        if (!locked_wallet) {
            return false;
        }
        auto mi = m_wallet->mapWallet.find(txid);
        if (mi == m_wallet->mapWallet.end()) {
            return false;
        }
        num_blocks = m_wallet->GetLastBlockHeight();
        block_time = -1;
        CHECK_NONFATAL(m_wallet->chain().findBlock(m_wallet->GetLastBlockHash(), FoundBlock().time(block_time)));
        tx_status = MakeWalletTxStatus(*m_wallet, mi->second);
        return true;
    }